

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O1

bool __thiscall catalog::createIndex(catalog *this,IndexInfo *indexinfo)

{
  _Rb_tree_node_base *p_Var1;
  TableInfo *pTVar2;
  _Base_ptr p_Var3;
  size_t __n;
  pointer pcVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  _Rb_tree_node_base *p_Var8;
  iterator iVar9;
  ostream *poVar10;
  _Self __tmp;
  _Base_ptr p_Var11;
  char *pcVar12;
  _Base_ptr p_Var13;
  long lVar14;
  bool bVar15;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p;
  int local_6c;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  bVar6 = 0 < this->tableNumber;
  if (this->tableNumber < 1) {
    local_6c = -1;
  }
  else {
    local_6c = -1;
    lVar14 = 0;
    do {
      pTVar2 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar14];
      p_Var8 = *(_Base_ptr *)((long)&(pTVar2->indexInfo)._M_t._M_impl + 0x18);
      p_Var1 = (_Rb_tree_node_base *)((long)&(pTVar2->indexInfo)._M_t._M_impl + 8);
      bVar15 = p_Var8 == p_Var1;
      iVar5 = local_6c;
      if (!bVar15) {
        p_Var3 = (_Base_ptr)(indexinfo->indexName)._M_string_length;
        do {
          if ((p_Var3 == p_Var8[1]._M_left) &&
             ((p_Var3 == (_Base_ptr)0x0 ||
              (iVar7 = bcmp((indexinfo->indexName)._M_dataplus._M_p,p_Var8[1]._M_parent,
                            (size_t)p_Var3), iVar7 == 0)))) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"index ",6);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(indexinfo->indexName)._M_dataplus._M_p,
                                 (indexinfo->indexName)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," already exists in ",0x13);
            pTVar2 = (this->TableInfoList).
                     super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar14];
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(pTVar2->tableName)._M_dataplus._M_p,
                                 (pTVar2->tableName)._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            goto LAB_0011d42f;
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
          bVar15 = p_Var8 == p_Var1;
        } while (!bVar15);
      }
      __n = (pTVar2->tableName)._M_string_length;
      if (((__n == (indexinfo->tableName)._M_string_length) && (iVar5 = (int)lVar14, __n != 0)) &&
         (iVar7 = bcmp((pTVar2->tableName)._M_dataplus._M_p,(indexinfo->tableName)._M_dataplus._M_p,
                       __n), iVar5 = local_6c, iVar7 == 0)) {
        iVar5 = (int)lVar14;
      }
LAB_0011d42f:
      local_6c = iVar5;
      if (!bVar15) break;
      lVar14 = lVar14 + 1;
      bVar6 = lVar14 < this->tableNumber;
    } while (lVar14 < this->tableNumber);
  }
  if (bVar6) {
    return false;
  }
  if (local_6c == -1) {
    pcVar12 = "can not find table in list";
    lVar14 = 0x1a;
    poVar10 = (ostream *)&std::cout;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"i find table in list",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    lVar14 = (long)local_6c;
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&((this->TableInfoList).
                     super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar14]->getID)._M_t,&indexinfo->colunmName);
    pTVar2 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar14];
    if (iVar9._M_node != (_Base_ptr)((long)&(pTVar2->getID)._M_t._M_impl + 8U)) {
      p_Var13 = *(_Base_ptr *)((long)&(pTVar2->indexInfo)._M_t._M_impl + 0x10);
      p_Var3 = (_Base_ptr)((long)&(pTVar2->indexInfo)._M_t._M_impl + 8);
      p_Var11 = p_Var3;
      if (p_Var13 != (_Base_ptr)0x0) {
        do {
          if ((int)iVar9._M_node[2]._M_color <= (int)p_Var13[1]._M_color) {
            p_Var11 = p_Var13;
          }
          p_Var13 = (&p_Var13->_M_left)[(int)p_Var13[1]._M_color < (int)iVar9._M_node[2]._M_color];
        } while (p_Var13 != (_Base_ptr)0x0);
      }
      p_Var13 = p_Var3;
      if ((p_Var11 != p_Var3) &&
         (p_Var13 = p_Var11, (int)iVar9._M_node[2]._M_color < (int)p_Var11[1]._M_color)) {
        p_Var13 = p_Var3;
      }
      if (p_Var13 == p_Var3) {
        *(undefined4 *)
         (*(long *)&(pTVar2->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data + (long)(int)iVar9._M_node[2]._M_color * 4) = 4;
        local_58._0_4_ = iVar9._M_node[2]._M_color;
        pcVar4 = (indexinfo->indexName)._M_dataplus._M_p;
        local_50._M_p = (pointer)&local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar4,pcVar4 + (indexinfo->indexName)._M_string_length);
        std::
        _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<int,std::__cxx11::string>&>
                  ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                    *)&(this->TableInfoList).
                       super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14]->indexInfo,
                   (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_58);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"create index ",0xd);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(indexinfo->indexName)._M_dataplus._M_p,
                             (indexinfo->indexName)._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        if (this->anychangeornot == false) {
          this->anychangeornot = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_p != &local_40) {
          operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
        }
        return true;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"index already exists in ",0x18);
      pTVar2 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar14];
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(pTVar2->tableName)._M_dataplus._M_p,
                           (pTVar2->tableName)._M_string_length);
      lVar14 = *(long *)poVar10;
      goto LAB_0011d5c9;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"can not find colunm ",0x14);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(indexinfo->colunmName)._M_dataplus._M_p,
                         (indexinfo->colunmName)._M_string_length);
    pcVar12 = " in list";
    lVar14 = 8;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,lVar14);
  lVar14 = *(long *)poVar10;
LAB_0011d5c9:
  std::ios::widen((char)*(undefined8 *)(lVar14 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  return false;
}

Assistant:

bool catalog::createIndex(IndexInfo *indexinfo){
    int pos = -1;
    for(int i = 0 ; i < tableNumber ; i ++){
        std::map<int,std::string>::iterator it;
        it = TableInfoList[i]->indexInfo.begin();
        while(it != TableInfoList[i]->indexInfo.end())
        {
            //检查每个表上indexName是否被占用
            // std::cout << it->second <<std::endl;
            // if(indexinfo->indexID == TableInfoList[])
            if(indexinfo->indexName == it->second){
                 std::cout<<"index "<<indexinfo->indexName <<" already exists in "<<TableInfoList[i]->tableName<<std::endl;
                 return false;
            }
            it ++;         
        }
        //
        if(TableInfoList[i]->tableName == indexinfo->tableName){
            pos = i;
        }
    }

    //
    if(pos == -1){
        std::cout<<"can not find table in list"<<std::endl;
        return false;
    }
    std::cout<<"i find table in list"<<std::endl;
    auto it = TableInfoList[pos]->getID.find(indexinfo->colunmName);
    if(it!=TableInfoList[pos]->getID.end()){
        //这个列名存在
        auto x = TableInfoList[pos]->indexInfo.find(it->second);
        if(x!=TableInfoList[pos]->indexInfo.end()){
            //这个列已经被建立索引
            std::cout<<"index already exists in "<<TableInfoList[pos]->tableName<<std::endl;
            return false;
        }

    }else{
        std::cout<<"can not find colunm "<<indexinfo->colunmName <<" in list"<<std::endl;
        return false;
    }
    //先修改constraint
    TableInfoList[pos]->constraint[it->second] = 4;
    //修改indexInfo
    std::pair<int,std::string> p = std::make_pair(it->second, indexinfo->indexName);      
    TableInfoList[pos]->indexInfo.insert(p);
    std::cout<<"create index "<<indexinfo->indexName<<std::endl;
    if(!anychangeornot)anychangeornot = true;
    return true;
}